

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<6UL,_GF2::MOGrevlex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SPoly
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *poly)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  
  p_Var6 = (this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  uVar2 = (ulong)p_Var6[1]._M_next;
  uVar3 = (ulong)(poly->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
  psVar1 = &(this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
            super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var6,0x18);
  p_Var6 = (this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)this) {
    do {
      *(ulong *)&((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var6 + 1))->
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> =
           *(ulong *)&((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var6 + 1))->
                      super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> |
           ~uVar2 & uVar3;
      p_Var6 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var6->_M_next)->
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var6 != (_List_node_base *)this);
  }
  p_Var6 = (poly->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var7 = p_Var6->_M_next;
  if (p_Var7 != (_List_node_base *)poly) {
    uVar4 = (ulong)p_Var6[1]._M_next;
    do {
      uVar5 = *(ulong *)&((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var7 + 1))->
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = (_List_node_base *)(uVar5 | ~uVar4 & (uVar3 | uVar2));
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var7 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var7->_M_next)->
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)poly);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly)
	{
		// предусловия
		assert(IsConsistent(poly) && this != &poly);
		// сбор мономов
		MM<_n> lm, m;
		(m = lm.LCM(LM(), poly.LM())) /= LM();
		PopLM();
		for (iterator iter = begin(); iter != end(); ++iter)
			*iter *= m;
		lm /= poly.LM();
		for (const_iterator iter = poly.begin(); ++iter != poly.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}